

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeZ.cpp
# Opt level: O3

void __thiscall OpenMD::ChargeZ::process(ChargeZ *this)

{
  undefined8 *puVar1;
  vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *this_00;
  double dVar2;
  undefined8 uVar3;
  char cVar4;
  SimInfo *info;
  Snapshot *pSVar5;
  long lVar6;
  iterator iVar7;
  iterator __position;
  pointer pdVar8;
  StuntDouble *pSVar9;
  AtomType *pAVar10;
  RealType RVar11;
  SelectionManager *this_01;
  bool bVar12;
  int iVar13;
  pointer pvVar14;
  uint i_1;
  double *__args;
  SelectionSet *pSVar15;
  ulong uVar16;
  uint i;
  long lVar17;
  pointer ppSVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  Vector3d pos;
  RealType area;
  StuntDouble *sd;
  int ii;
  FluctuatingChargeAdapter fqa;
  Mat3x3d hmat;
  DumpReader reader;
  SelectionSet local_1348;
  double local_1328;
  double local_1320;
  StuntDouble *local_1318;
  int local_1310;
  int local_130c;
  double local_1308;
  vector<double,std::allocator<double>> *local_1300;
  vector<double,std::allocator<double>> *local_12f8;
  SelectionEvaluator *local_12f0;
  SelectionManager *local_12e8;
  ulong local_12e0;
  FluctuatingChargeAdapter local_12d8;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar4 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar13 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar13 / (this->super_StaticAnalyser).step_;
  if (0 < iVar13) {
    local_12f8 = (vector<double,std::allocator<double>> *)&this->zBox_;
    local_1300 = (vector<double,std::allocator<double>> *)&this->areas_;
    local_12f0 = &this->evaluator_;
    local_12e8 = &this->seleMan_;
    uVar21 = 0;
    local_1310 = iVar13;
    do {
      this_01 = local_12e8;
      local_12e0 = uVar21;
      DumpReader::readFrame(&local_1288,(int)uVar21);
      pSVar5 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      this->currentSnapshot_ = pSVar5;
      uVar21 = (ulong)(this->super_StaticAnalyser).nBins_;
      if (uVar21 != 0) {
        pvVar14 = (this->sliceSDLists_).
                  super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar17 = 0;
        do {
          lVar6 = *(long *)((long)&(pvVar14->
                                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar17);
          if (*(long *)((long)&(pvVar14->
                               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar17) != lVar6) {
            *(long *)((long)&(pvVar14->
                             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish + lVar17) = lVar6;
          }
          lVar17 = lVar17 + 0x18;
        } while (uVar21 * 0x18 != lVar17);
      }
      Snapshot::getHmat(&local_12d0,pSVar5);
      uVar19 = this->axis_;
      __args = (double *)
               ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)uVar19 * 0x20);
      iVar7._M_current =
           (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_12f8,iVar7,__args);
        uVar19 = this->axis_;
        uVar3 = *(undefined8 *)
                 ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_ + (ulong)uVar19 * 0x20);
        uVar22 = (undefined4)uVar3;
        uVar23 = (undefined4)((ulong)uVar3 >> 0x20);
      }
      else {
        dVar2 = *__args;
        uVar22 = SUB84(dVar2,0);
        uVar23 = (undefined4)((ulong)dVar2 >> 0x20);
        *iVar7._M_current = dVar2;
        (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      local_1328 = (double)CONCAT44(uVar23,uVar22) * 0.5;
      local_1320 = 0.0;
      pSVar5 = this->currentSnapshot_;
      if (uVar19 == 0) {
        RVar11 = Snapshot::getYZarea(pSVar5);
        uVar22 = SUB84(RVar11,0);
        uVar23 = (undefined4)((ulong)RVar11 >> 0x20);
      }
      else if (uVar19 == 1) {
        RVar11 = Snapshot::getXZarea(pSVar5);
        uVar22 = SUB84(RVar11,0);
        uVar23 = (undefined4)((ulong)RVar11 >> 0x20);
      }
      else {
        RVar11 = Snapshot::getXYarea(pSVar5);
        uVar22 = SUB84(RVar11,0);
        uVar23 = (undefined4)((ulong)RVar11 >> 0x20);
      }
      local_1320 = (double)CONCAT44(uVar23,uVar22);
      iVar7._M_current =
           (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_1300,iVar7,&local_1320);
      }
      else {
        *iVar7._M_current = (double)CONCAT44(uVar23,uVar22);
        (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1348,local_12f0);
        lVar17 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar17),(vector<bool,_std::allocator<bool>_> *)
                             ((long)&((local_1348.bitsets_.
                                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + lVar17));
          lVar17 = lVar17 + 0x28;
        } while (lVar17 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1348.bitsets_);
      }
      local_1318 = SelectionManager::beginSelected(this_01,&local_130c);
      while (local_1318 != (StuntDouble *)0x0) {
        pSVar15 = (SelectionSet *)
                  ((long)local_1318->localIndex_ * 0x18 +
                  *(long *)((long)&(local_1318->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_1318->storage_)
                  );
        local_1348.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1348.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1348.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pSVar15 != &local_1348) {
          lVar17 = 0;
          do {
            (&local_1348.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar17] =
                 (&(pSVar15->bitsets_).
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
        }
        if (cVar4 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1348);
        }
        pSVar15 = (SelectionSet *)
                  ((long)local_1318->localIndex_ * 0x18 +
                  *(long *)((long)&(local_1318->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_1318->storage_)
                  );
        if (pSVar15 != &local_1348) {
          lVar17 = 0;
          do {
            (&(pSVar15->bitsets_).
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar17] =
                 (&local_1348.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
        }
        local_1318 = SelectionManager::nextSelected(this_01,&local_130c);
      }
      local_1318 = SelectionManager::beginSelected(this_01,&local_130c);
      while (local_1318 != (StuntDouble *)0x0) {
        lVar17 = *(long *)((long)&(local_1318->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_1318->storage_);
        local_1348.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)(lVar17 + 0x10 + (long)local_1318->localIndex_ * 0x18);
        puVar1 = (undefined8 *)(lVar17 + (long)local_1318->localIndex_ * 0x18);
        local_1348.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*puVar1;
        local_1348.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)puVar1[1];
        iVar13 = (int)((((double)(&local_1348.bitsets_.
                                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                   ._M_impl.super__Vector_impl_data._M_start)[(uint)this->axis_] +
                        local_1328) * (double)(this->super_StaticAnalyser).nBins_) /
                      *(double *)
                       ((long)local_12d0.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_ +
                       (ulong)(uint)this->axis_ * 0x20));
        this_00 = (vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)
                  ((this->sliceSDLists_).
                   super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar13);
        __position._M_current = *(StuntDouble ***)(this_00 + 8);
        if (__position._M_current == *(StuntDouble ***)(this_00 + 0x10)) {
          std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
          _M_realloc_insert<OpenMD::StuntDouble*const&>(this_00,__position,&local_1318);
        }
        else {
          *__position._M_current = local_1318;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        pdVar8 = (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8[iVar13] = pdVar8[iVar13] + 1.0;
        local_1318 = SelectionManager::nextSelected(this_01,&local_130c);
      }
      uVar19 = (this->super_StaticAnalyser).nBins_;
      if (uVar19 != 0) {
        pvVar14 = (this->sliceSDLists_).
                  super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar21 = 0;
        do {
          ppSVar18 = pvVar14[uVar21].
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (pvVar14[uVar21].
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish == ppSVar18) {
            dVar2 = 0.0;
          }
          else {
            dVar2 = 0.0;
            uVar16 = 0;
            uVar20 = 1;
            do {
              pSVar9 = ppSVar18[uVar16];
              dVar24 = 0.0;
              if (pSVar9->objType_ < otRigidBody) {
                pAVar10 = (AtomType *)pSVar9[1]._vptr_StuntDouble;
                local_1348.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)pAVar10;
                local_1328 = dVar2;
                bVar12 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)&local_1348);
                dVar2 = 0.0;
                if (bVar12) {
                  RVar11 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)&local_1348);
                  dVar2 = RVar11 + 0.0;
                }
                local_1308 = dVar2;
                local_12d8.at_ = pAVar10;
                bVar12 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_12d8);
                dVar24 = local_1308;
                if (bVar12) {
                  dVar24 = local_1308 +
                           *(double *)
                            (*(long *)((long)&(pSVar9->snapshotMan_->currentSnapshot_->atomData).
                                              flucQPos.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                      pSVar9->storage_) + (long)pSVar9->localIndex_ * 8);
                }
                pvVar14 = (this->sliceSDLists_).
                          super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                dVar2 = local_1328;
              }
              dVar2 = dVar2 + dVar24;
              ppSVar18 = pvVar14[uVar21].
                         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              bVar12 = uVar20 < (ulong)((long)pvVar14[uVar21].
                                              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppSVar18 >> 3);
              uVar16 = uVar20;
              uVar20 = (ulong)((int)uVar20 + 1);
            } while (bVar12);
            uVar19 = (this->super_StaticAnalyser).nBins_;
          }
          pdVar8 = (this->chargeZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8[uVar21] = dVar2 + pdVar8[uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar21 < uVar19);
      }
      uVar19 = (int)local_12e0 + (this->super_StaticAnalyser).step_;
      uVar21 = (ulong)uVar19;
    } while ((int)uVar19 < local_1310);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void ChargeZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins_; i++) {
        sliceSDLists_[i].clear();
      }

      Mat3x3d hmat = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;
      RealType area      = 0.0;
      switch (axis_) {
      case 0:
        area = currentSnapshot_->getYZarea();
        break;
      case 1:
        area = currentSnapshot_->getXZarea();
        break;
      case 2:
      default:
        area = currentSnapshot_->getXYarea();
        break;
      }

      areas_.push_back(area);

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo = int(nBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
        sliceSDLists_[binNo].push_back(sd);
        sliceSDCount_[binNo]++;
      }

      // loop over the slices to calculate the charge
      for (unsigned int i = 0; i < nBins_; i++) {
        RealType binC = 0;
        for (unsigned int k = 0; k < sliceSDLists_[i].size(); ++k) {
          RealType q = 0.0;
          Atom* atom = static_cast<Atom*>(sliceSDLists_[i][k]);

          AtomType* atomType = atom->getAtomType();

          if (sliceSDLists_[i][k]->isAtom()) {
            FixedChargeAdapter fca = FixedChargeAdapter(atomType);
            if (fca.isFixedCharge()) { q += fca.getCharge(); }

            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }
          }

          binC += q;
        }
        chargeZ_[i] += binC;
        // Units of (e / Ang^2 / fs)
      }
    }

    writeChargeZ();
  }